

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# widgets.cpp
# Opt level: O1

void __thiscall CMU462::DynamicScene::XFormWidget::drawCenterHandle(XFormWidget *this)

{
  double dVar1;
  double dVar2;
  double dVar3;
  pointer pVVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  Vector3D p11;
  Vector3D p10;
  Vector3D p01;
  Vector3D p00;
  double local_90;
  double local_88;
  double local_80;
  double local_78;
  double local_70;
  double local_68;
  double local_60;
  double local_58;
  double local_50;
  double local_48;
  double local_40;
  double local_38;
  
  dVar1 = (this->center).x;
  dVar2 = (this->center).y;
  dVar12 = (this->bounds).max.x - (this->bounds).min.x;
  dVar13 = (this->bounds).max.y - (this->bounds).min.y;
  dVar3 = (this->center).z;
  dVar10 = (this->bounds).max.z - (this->bounds).min.z;
  dVar10 = dVar10 * dVar10 + dVar12 * dVar12 + dVar13 * dVar13;
  if (dVar10 < 0.0) {
    dVar10 = sqrt(dVar10);
  }
  else {
    dVar10 = SQRT(dVar10);
  }
  glBegin(7);
  glColor4ubv((this->axisColors).
              super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start[3].
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start);
  dVar12 = dVar10 * 0.5 * 0.15;
  uVar5 = 0;
  do {
    uVar6 = uVar5 + 1;
    uVar8 = 0;
    if (uVar6 != 3) {
      uVar8 = uVar6 & 0xffffffff;
    }
    uVar7 = ((int)uVar5 + 2U) % 3;
    uVar9 = 0xfffffffd;
    dVar13 = -1.0;
    do {
      dVar11 = dVar10 * 0.5 * dVar13 * 0.15;
      pVVar4 = (this->axes).super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>.
               _M_impl.super__Vector_impl_data._M_start;
      local_90 = pVVar4[uVar5].x * dVar11 + dVar1;
      local_88 = pVVar4[uVar5].y * dVar11 + dVar2;
      local_80 = dVar11 * pVVar4[uVar5].z + dVar3;
      local_48 = (-pVVar4[uVar8].x - pVVar4[uVar7].x) * dVar12 + local_90;
      local_40 = (-pVVar4[uVar8].y - pVVar4[uVar7].y) * dVar12 + local_88;
      local_38 = (-pVVar4[uVar8].z - pVVar4[uVar7].z) * dVar12 + local_80;
      local_60 = (pVVar4[uVar7].x - pVVar4[uVar8].x) * dVar12 + local_90;
      local_58 = (pVVar4[uVar7].y - pVVar4[uVar8].y) * dVar12 + local_88;
      local_50 = (pVVar4[uVar7].z - pVVar4[uVar8].z) * dVar12 + local_80;
      local_78 = (pVVar4[uVar8].x - pVVar4[uVar7].x) * dVar12 + local_90;
      local_70 = (pVVar4[uVar8].y - pVVar4[uVar7].y) * dVar12 + local_88;
      local_68 = (pVVar4[uVar8].z - pVVar4[uVar7].z) * dVar12 + local_80;
      local_90 = (pVVar4[uVar8].x + pVVar4[uVar7].x) * dVar12 + local_90;
      local_88 = (pVVar4[uVar8].y + pVVar4[uVar7].y) * dVar12 + local_88;
      local_80 = (pVVar4[uVar8].z + pVVar4[uVar7].z) * dVar12 + local_80;
      glVertex3dv(&local_48);
      glVertex3dv(&local_60);
      glVertex3dv(&local_90);
      glVertex3dv(&local_78);
      dVar13 = dVar13 + 2.0;
      uVar9 = uVar9 + 2;
    } while (0xfffffffd < uVar9);
    uVar5 = uVar6;
  } while (uVar6 != 3);
  glEnd();
  return;
}

Assistant:

void XFormWidget::drawCenterHandle() const
{
   const double handleSize = .15;
   
   Vector3D c = center;

   double r = (bounds.max - bounds.min).norm() / 2.;

   // Draw center box
   glBegin( GL_QUADS );
   glColor4ubv( &axisColors[3][0] );
   for( int i = 0; i < 3; i++ )
   {
      for( double s = -1.; s <= 1.; s+= 2. )
      {
         Vector3D p = c + r*s*handleSize*axes[i];
         Vector3D p00 = p + r*handleSize*( -axes[(i+1)%3] - axes[(i+2)%3] );
         Vector3D p01 = p + r*handleSize*( -axes[(i+1)%3] + axes[(i+2)%3] );
         Vector3D p10 = p + r*handleSize*(  axes[(i+1)%3] - axes[(i+2)%3] );
         Vector3D p11 = p + r*handleSize*(  axes[(i+1)%3] + axes[(i+2)%3] );

         glVertex3dv( &p00.x );
         glVertex3dv( &p01.x );
         glVertex3dv( &p11.x );
         glVertex3dv( &p10.x );
      }
   }
   glEnd();
}